

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprawpacket.h
# Opt level: O0

void __thiscall jrtplib::RTPRawPacket::DeleteData(RTPRawPacket *this)

{
  uint8_t *buf;
  RTPAddress *obj;
  RTPMemoryManager *pRVar1;
  RTPRawPacket *this_local;
  
  if (this->packetdata != (uint8_t *)0x0) {
    buf = this->packetdata;
    pRVar1 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDeleteByteArray(buf,pRVar1);
  }
  if (this->senderaddress != (RTPAddress *)0x0) {
    obj = this->senderaddress;
    pRVar1 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPAddress>(obj,pRVar1);
  }
  this->packetdata = (uint8_t *)0x0;
  this->senderaddress = (RTPAddress *)0x0;
  return;
}

Assistant:

inline void RTPRawPacket::DeleteData()
{
	if (packetdata)
		RTPDeleteByteArray(packetdata,GetMemoryManager());
	if (senderaddress)
		RTPDelete(senderaddress,GetMemoryManager());

	packetdata = 0;
	senderaddress = 0;
}